

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_primitives.cc
# Opt level: O3

uint64_t hashstring(substring s,uint64_t h)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte *pbVar10;
  byte *pbVar11;
  
  pbVar7 = (byte *)s.end;
  pbVar8 = (byte *)s.begin;
  pbVar11 = pbVar8;
  pbVar9 = pbVar8;
  if (pbVar8 < pbVar7) {
    do {
      pbVar11 = pbVar8;
      pbVar9 = pbVar8;
      if (0x20 < *pbVar8) break;
      pbVar8 = pbVar8 + 1;
      pbVar11 = pbVar7;
      pbVar9 = pbVar7;
    } while (pbVar8 != pbVar7);
  }
  do {
    pbVar10 = pbVar7;
    pbVar8 = pbVar11;
    if (pbVar10 <= pbVar9) break;
    pbVar11 = pbVar8 + 1;
    pbVar7 = pbVar10 + -1;
  } while (pbVar10[-1] < 0x21);
  lVar5 = 0;
  pbVar11 = pbVar9;
  while( true ) {
    if (pbVar10 == pbVar11) {
      return lVar5 + h;
    }
    bVar1 = *pbVar11;
    if (9 < (byte)(bVar1 - 0x30)) break;
    pbVar11 = pbVar11 + 1;
    lVar5 = (ulong)bVar1 + lVar5 * 10 + -0x30;
  }
  uVar4 = (int)s.end - (int)pbVar8;
  uVar6 = uVar4;
  if ((int)uVar4 < 0) {
    uVar6 = uVar4 + 3;
  }
  pbVar9 = pbVar9 + (int)(uVar6 & 0xfffffffc);
  if (6 < uVar4 + 3) {
    lVar5 = (long)-((int)uVar6 >> 2);
    do {
      uVar6 = ((uint)(*(int *)(pbVar9 + lVar5 * 4) * -0x3361d2af) >> 0x11 |
              *(int *)(pbVar9 + lVar5 * 4) * 0x16a88000) * 0x1b873593 ^ (uint)h;
      h = (uint64_t)((uVar6 << 0xd | uVar6 >> 0x13) * 5 + 0xe6546b64);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0);
  }
  uVar3 = (uint)h;
  uVar2 = 0;
  uVar6 = 0;
  switch(uVar4 & 3) {
  case 3:
    uVar6 = (uint)pbVar9[2] << 0x10;
  case 2:
    uVar2 = uVar6 | (uint)pbVar9[1] << 8;
  case 1:
    uVar3 = ((*pbVar9 ^ uVar2) * -0x3361d2af >> 0x11 | (*pbVar9 ^ uVar2) * 0x16a88000) * 0x1b873593
            ^ uVar3;
  case 0:
    uVar4 = ((uVar4 ^ uVar3) >> 0x10 ^ uVar4 ^ uVar3) * -0x7a143595;
    uVar4 = (uVar4 >> 0xd ^ uVar4) * -0x3d4d51cb;
    return (ulong)(uVar4 >> 0x10 ^ uVar4);
  }
}

Assistant:

uint64_t hashstring(substring s, uint64_t h)
{
  // trim leading whitespace but not UTF-8
  for (; s.begin < s.end && *(s.begin) <= 0x20 && (int)*(s.begin) >= 0; s.begin++)
    ;
  // trim trailing white space but not UTF-8
  for (; s.end > s.begin && *(s.end - 1) <= 0x20 && (int)*(s.end - 1) >= 0; s.end--)
    ;

  size_t ret = 0;
  char* p = s.begin;
  while (p != s.end)
    if (*p >= '0' && *p <= '9')
      ret = 10 * ret + *(p++) - '0';
    else
      return uniform_hash((unsigned char*)s.begin, s.end - s.begin, h);

  return ret + h;
}